

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

double __thiscall llvm::detail::frexp(detail *this,double __x,int *__exponent)

{
  IEEEFloat *rhs;
  Storage *this_00;
  long lVar1;
  long lVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_00;
  double extraout_XMM0_Qa_01;
  APFloat Second;
  APFloat First;
  APFloat local_b0;
  undefined1 local_90 [40];
  IEEEFloat local_68;
  undefined1 local_50 [8];
  Storage local_48;
  
  if (*(undefined1 **)__exponent == semPPCDoubleDouble) {
    llvm::frexp((llvm *)local_90,__x,*(int **)(__exponent + 2));
    this_00 = &local_b0.U;
    rhs = (IEEEFloat *)(*(long *)(__exponent + 2) + 0x28);
    if (*(undefined1 **)(*(long *)(__exponent + 2) + 0x28) == semPPCDoubleDouble) {
      DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)rhs);
    }
    else {
      IEEEFloat::IEEEFloat(&this_00->IEEE,rhs);
    }
    lVar1 = *(long *)(__exponent + 2);
    lVar2 = *(long *)(lVar1 + 0x10);
    if (*(undefined1 **)(lVar1 + 8) != semPPCDoubleDouble) {
      lVar2 = lVar1;
    }
    if ((*(byte *)(lVar2 + 0x1a) & 7) == 2) {
      if (local_b0.U.semantics == (fltSemantics *)semPPCDoubleDouble) {
        DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)&local_68,(DoubleAPFloat *)&this_00->IEEE);
        __x_00 = extraout_XMM0_Qa_00;
      }
      else {
        IEEEFloat::IEEEFloat(&local_68,&this_00->IEEE);
        __x_00 = extraout_XMM0_Qa;
      }
      llvm::scalbn(__x_00,(int)local_50);
      APFloat::Storage::operator=((Storage *)&this_00->IEEE,&local_48);
      APFloat::Storage::~Storage((Storage *)&local_48.IEEE);
      APFloat::Storage::~Storage((Storage *)&local_68);
    }
    DoubleAPFloat::DoubleAPFloat
              ((DoubleAPFloat *)this,(fltSemantics *)semPPCDoubleDouble,(APFloat *)local_90,
               &local_b0);
    APFloat::Storage::~Storage((Storage *)&this_00->IEEE);
    APFloat::Storage::~Storage((Storage *)(local_90 + 8));
    return extraout_XMM0_Qa_01;
  }
  __assert_fail("Arg.Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1135,
                "DoubleAPFloat llvm::detail::frexp(const DoubleAPFloat &, int &, APFloat::roundingMode)"
               );
}

Assistant:

DoubleAPFloat frexp(const DoubleAPFloat &Arg, int &Exp,
                    APFloat::roundingMode RM) {
  assert(Arg.Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat First = frexp(Arg.Floats[0], Exp, RM);
  APFloat Second = Arg.Floats[1];
  if (Arg.getCategory() == APFloat::fcNormal)
    Second = scalbn(Second, -Exp, RM);
  return DoubleAPFloat(semPPCDoubleDouble, std::move(First), std::move(Second));
}